

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O0

void AddVerifyBase<unsigned_int,int>(char *types)

{
  bool bVar1;
  char *pcVar2;
  TestCase<unsigned_int,_int,_3> TVar3;
  string msg_2;
  uint x;
  string msg_1;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  uint ret;
  TestCase<unsigned_int,_int,_3> test;
  TestVector<unsigned_int,_int,_3> tests;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffd80;
  allocator *in_stack_fffffffffffffd88;
  TestVector<unsigned_int,_int,_3> *in_stack_fffffffffffffd90;
  allocator local_209;
  string local_208 [15];
  undefined1 in_stack_fffffffffffffe07;
  int in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  string *in_stack_fffffffffffffe10;
  undefined1 local_1e1 [33];
  string local_1c0 [32];
  string local_1a0 [36];
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_17c;
  uint local_178;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_e8;
  byte local_e2;
  allocator local_e1;
  string local_e0 [55];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [40];
  undefined8 local_40;
  undefined1 local_38;
  undefined8 local_2c;
  byte local_24;
  TestVector<unsigned_int,_int,_3> local_20;
  
  TestVector<unsigned_int,_int,_3>::TestVector(&local_20);
  TVar3 = TestVector<unsigned_int,_int,_3>::GetNext(in_stack_fffffffffffffd90);
  local_40 = TVar3._0_8_;
  local_38 = TVar3.fExpected;
  local_2c = local_40;
  local_24 = local_38;
  while( true ) {
    bVar1 = TestVector<unsigned_int,_int,_3>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeAdd<unsigned_int,int>
                      ((uint)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                       (int)in_stack_fffffffffffffd80,
                       (uint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    if (bVar1 != (bool)(local_24 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Error in case ",&local_a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,pcVar2,&local_e1);
      err_msg<unsigned_int,int>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                 (bool)in_stack_fffffffffffffe07);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string(local_68);
    }
    local_e2 = 1;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_e8,(uint *)&local_2c);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator+=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
    if ((local_e2 & 1) != (local_24 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Error in case ",&local_149);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,pcVar2,&local_171);
      err_msg<unsigned_int,int>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                 (bool)in_stack_fffffffffffffe07);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::__cxx11::string::~string(local_108);
    }
    local_e2 = 1;
    local_178 = (uint)local_2c;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_17c,(int *)((long)&local_2c + 4));
    operator+=((uint *)in_stack_fffffffffffffd88,
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    if ((local_e2 & 1) != (local_24 & 1)) {
      in_stack_fffffffffffffd90 = (TestVector<unsigned_int,_int,_3> *)local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1e1 + 1),"Error in case ",(allocator *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string((string *)(local_1e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1e1);
      in_stack_fffffffffffffd80 =
           (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffd88 = &local_209;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_208,(char *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
      err_msg<unsigned_int,int>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                 (bool)in_stack_fffffffffffffe07);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      std::__cxx11::string::~string(local_1a0);
    }
    TVar3 = TestVector<unsigned_int,_int,_3>::GetNext(in_stack_fffffffffffffd90);
    local_2c = TVar3._0_8_;
    local_24 = TVar3.fExpected;
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}